

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool __thiscall ON_3dmUnitsAndTolerances::IsValid(ON_3dmUnitsAndTolerances *this)

{
  bool bVar1;
  
  bVar1 = false;
  if ((((uint)this->m_distance_display_precision < 9) && (this->m_distance_display_mode < 4)) &&
     (((this->m_absolute_tolerance <= 0.0 ||
       (((this->m_angle_tolerance <= 0.0 || (3.141592653589793 < this->m_angle_tolerance)) ||
        (this->m_relative_tolerance <= 0.0)))) || (bVar1 = true, 1.0 <= this->m_relative_tolerance))
     )) {
    return false;
  }
  return bVar1;
}

Assistant:

bool ON_3dmUnitsAndTolerances::IsValid() const
{
  for (;;)
  {
    // April 17, 2023 - Tim
    // Changed upper limit to 8 so we can use the display precision
    // stuff found in the annotation code for V8
    // Fixes https://mcneel.myjetbrains.com/youtrack/issue/RH-74242
    if (!(m_distance_display_precision >= 0 && m_distance_display_precision <= 8))
      break;

    if (!((int)m_distance_display_mode >= 0 && (int)m_distance_display_mode <= 3))
      break;

    if (!TolerancesAreValid())
      break;

    return true;
  }
  return false;
}